

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

size_t kvtree_elem_pack(char *buf,kvtree_elem *elem)

{
  size_t sVar1;
  size_t sVar2;
  size_t local_20;
  size_t size;
  kvtree_elem *elem_local;
  char *buf_local;
  
  if (elem == (kvtree_elem *)0x0) {
    *buf = '\0';
    local_20 = kvtree_pack(buf + 1,(kvtree *)0x0);
    local_20 = local_20 + 1;
  }
  else {
    if (elem->key == (char *)0x0) {
      *buf = '\0';
      local_20 = 1;
    }
    else {
      strcpy(buf,elem->key);
      sVar1 = strlen(elem->key);
      local_20 = sVar1 + 1;
    }
    sVar2 = kvtree_pack(buf + local_20,elem->hash);
    local_20 = sVar2 + local_20;
  }
  return local_20;
}

Assistant:

static size_t kvtree_elem_pack(char* buf, const kvtree_elem* elem)
{
  size_t size = 0;
  if (elem != NULL) {
    if (elem->key != NULL) {
      strcpy(buf + size, elem->key);
      size += strlen(elem->key) + 1;
    } else {
      buf[size] = '\0';
      size += 1;
    }
    size += kvtree_pack(buf + size, elem->hash);
  } else {
    buf[size] = '\0';
    size += 1;
    size += kvtree_pack(buf + size, NULL);
  }
  return size;
}